

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeT2AddrModeImm0_1020s4(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  
  uVar1 = Val >> 8 & 0xf;
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar1]);
  MCOperand_CreateImm0(Inst,(ulong)(byte)Val);
  return (uint)(uVar1 != 0xf) * 2 + MCDisassembler_SoftFail;
}

Assistant:

static DecodeStatus DecodeT2AddrModeImm0_1020s4(MCInst *Inst,unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 8, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 8);

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, imm);

	return S;
}